

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O0

void __thiscall
portability_path_test_portability_path_test_canonical_relative_begin_end_dot_Test::
~portability_path_test_portability_path_test_canonical_relative_begin_end_dot_Test
          (portability_path_test_portability_path_test_canonical_relative_begin_end_dot_Test *this)

{
  void *in_RDI;
  
  ~portability_path_test_portability_path_test_canonical_relative_begin_end_dot_Test
            ((portability_path_test_portability_path_test_canonical_relative_begin_end_dot_Test *)
             0x1223d8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_canonical_relative_begin_end_dot)
{
	static const char path[] = "./.";
	static const char result[] = ".";

	string_path canonical;

	size_t size = portability_path_canonical(path, sizeof(path), canonical, PATH_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(canonical, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}